

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::SetupDataSource
          (ProducerEndpointImpl *this,DataSourceInstanceID ds_id,DataSourceConfig *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TaskRunner *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  undefined8 *local_388;
  undefined8 uStack_380;
  code *local_378;
  code *pcStack_370;
  element_type *local_360;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  DataSourceInstanceID local_350;
  DataSourceConfig local_348;
  
  local_360 = (element_type *)CONCAT62(local_360._2_6_,(short)config->target_buffer_);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::_M_insert_unique<unsigned_short>
            (&(this->allowed_target_buffers_)._M_t,(unsigned_short *)&local_360);
  local_360 = (this->weak_ptr_factory_).weak_ptr_.handle_.
              super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pTVar1 = this->task_runner_;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_358 = this_00;
  local_350 = ds_id;
  protos::gen::DataSourceConfig::DataSourceConfig(&local_348,config);
  local_378 = (code *)0x0;
  pcStack_370 = (code *)0x0;
  local_388 = (undefined8 *)0x0;
  uStack_380 = 0;
  puVar3 = (undefined8 *)operator_new(0x338);
  p_Var2 = local_358;
  *puVar3 = local_360;
  puVar3[1] = 0;
  local_358 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar3[1] = p_Var2;
  local_360 = (element_type *)0x0;
  puVar3[2] = local_350;
  protos::gen::DataSourceConfig::DataSourceConfig((DataSourceConfig *)(puVar3 + 3),&local_348);
  pcStack_370 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60077:26)>
                ::_M_invoke;
  local_378 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:60077:26)>
              ::_M_manager;
  local_388 = puVar3;
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1);
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,3);
  }
  protos::gen::DataSourceConfig::~DataSourceConfig(&local_348);
  if (local_358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::SetupDataSource(
    DataSourceInstanceID ds_id,
    const DataSourceConfig& config) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  allowed_target_buffers_.insert(static_cast<BufferID>(config.target_buffer()));
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, ds_id, config] {
    if (weak_this)
      weak_this->producer_->SetupDataSource(ds_id, std::move(config));
  });
}